

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.c
# Opt level: O0

bool is_safe_spell(CHAR_DATA *ch,CHAR_DATA *victim,bool area)

{
  byte bVar1;
  bool bVar2;
  byte in_DL;
  CHAR_DATA *in_RSI;
  CHAR_DATA *in_RDI;
  __type_conflict2 _Var3;
  CHAR_DATA *in_stack_ffffffffffffff98;
  undefined8 in_stack_ffffffffffffffa0;
  int sn;
  ulong uVar4;
  CHAR_DATA *in_stack_ffffffffffffffa8;
  
  sn = (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20);
  bVar1 = in_DL & 1;
  if ((in_RSI->in_room == (ROOM_INDEX_DATA *)0x0) || (in_RDI->in_room == (ROOM_INDEX_DATA *)0x0)) {
    return true;
  }
  if ((in_RSI == in_RDI) && (bVar1 != 0)) {
    return true;
  }
  bVar2 = is_affected_by(in_stack_ffffffffffffffa8,sn);
  if (bVar2) {
    return true;
  }
  if ((in_RSI->fighting == in_RDI) || (in_RSI == in_RDI)) {
    return false;
  }
  bVar2 = is_immortal(in_stack_ffffffffffffff98);
  if (((bVar2) && (0x34 < in_RDI->level)) && (bVar1 == 0)) {
    return false;
  }
  bVar2 = is_npc(in_stack_ffffffffffffff98);
  if (((!bVar2) && ((in_RSI->pcdata->newbie & 1U) == 1)) &&
     (bVar2 = is_npc(in_stack_ffffffffffffff98), !bVar2)) {
    return true;
  }
  bVar2 = is_npc(in_stack_ffffffffffffff98);
  if (((!bVar2) && ((in_RDI->pcdata->newbie & 1U) == 1)) &&
     (bVar2 = is_npc(in_stack_ffffffffffffff98), !bVar2)) {
    return true;
  }
  bVar2 = is_npc(in_stack_ffffffffffffff98);
  if (bVar2) {
    uVar4 = in_RSI->in_room->room_flags[0];
    _Var3 = std::pow<int,int>(0,0x5e415a);
    if ((uVar4 & (long)_Var3) != 0) {
      return true;
    }
    if (in_RSI->pIndexData->pShop != (SHOP_DATA *)0x0) {
      return true;
    }
    uVar4 = in_RSI->act[0];
    _Var3 = std::pow<int,int>(0,0x5e41b1);
    if ((((uVar4 & (long)_Var3) != 0) ||
        (uVar4 = in_RSI->act[0], _Var3 = std::pow<int,int>(0,0x5e41e4), (uVar4 & (long)_Var3) != 0))
       || (uVar4 = in_RSI->act[0], _Var3 = std::pow<int,int>(0,0x5e4217), (uVar4 & (long)_Var3) != 0
          )) {
      return true;
    }
    bVar2 = is_npc(in_stack_ffffffffffffff98);
    if (bVar2) {
      if ((bVar1 != 0) && (bVar2 = is_same_group(in_RSI,in_RDI->fighting), !bVar2)) {
        return true;
      }
    }
    else {
      uVar4 = in_RSI->act[0];
      _Var3 = std::pow<int,int>(0,0x5e4266);
      if ((uVar4 & (long)_Var3) != 0) {
        return true;
      }
      bVar2 = is_affected_by(in_stack_ffffffffffffffa8,sn);
      if ((bVar2) && ((bVar1 != 0 || (in_RDI != in_RSI->master)))) {
        return true;
      }
      if ((in_RSI->fighting != (CHAR_DATA *)0x0) &&
         (bVar2 = is_same_group(in_RDI,in_RSI->fighting), !bVar2)) {
        return true;
      }
    }
  }
  else {
    if (((bVar1 != 0) && (bVar2 = is_immortal(in_stack_ffffffffffffff98), bVar2)) &&
       (0x34 < in_RSI->level)) {
      return true;
    }
    bVar2 = is_npc(in_stack_ffffffffffffff98);
    if (!bVar2) {
      bVar2 = is_cabal(in_RDI);
      if (!bVar2) {
        return true;
      }
      uVar4 = in_RSI->act[0];
      _Var3 = std::pow<int,int>(0,0x5e4449);
      if ((uVar4 & (long)_Var3) == 0) {
        uVar4 = in_RSI->act[0];
        _Var3 = std::pow<int,int>(0,0x5e447c);
        if ((uVar4 & (long)_Var3) == 0) {
          bVar2 = is_cabal(in_RSI);
          if (!bVar2) {
            return true;
          }
          if ((int)in_RDI->level <= in_RSI->level + 8) {
            return false;
          }
          return true;
        }
      }
      return false;
    }
    bVar2 = is_affected_by(in_stack_ffffffffffffffa8,sn);
    if (((bVar2) && (in_RDI->master != (CHAR_DATA *)0x0)) && (in_RDI->master->fighting != in_RSI)) {
      return true;
    }
    uVar4 = in_RSI->in_room->room_flags[0];
    _Var3 = std::pow<int,int>(0,0x5e43c2);
    if ((uVar4 & (long)_Var3) != 0) {
      return true;
    }
    if ((in_RDI->fighting != (CHAR_DATA *)0x0) &&
       (bVar2 = is_same_group(in_RDI->fighting,in_RSI), !bVar2)) {
      return true;
    }
  }
  return false;
}

Assistant:

bool is_safe_spell(CHAR_DATA *ch, CHAR_DATA *victim, bool area)
{
	if (victim->in_room == nullptr || ch->in_room == nullptr)
		return true;

	if (victim == ch && area)
		return true;

	if (is_affected_by(victim, AFF_NOSHOW))
		return true;

	if (victim->fighting == ch || victim == ch)
		return false;

	if (is_immortal(ch) && ch->level > LEVEL_IMMORTAL && !area)
		return false;

	if (!is_npc(victim) && victim->pcdata->newbie == true && !is_npc(ch))
		return true;

	if (!is_npc(ch) && ch->pcdata->newbie == true && !is_npc(victim))
		return true;

	/* killing mobiles */
	if (is_npc(victim))
	{
		/* safe room? */
		if (IS_SET(victim->in_room->room_flags, ROOM_SAFE))
			return true;

		if (victim->pIndexData->pShop != nullptr)
			return true;

		/* no killing healers, trainers, etc */
		if (IS_SET(victim->act, ACT_TRAIN) || IS_SET(victim->act, ACT_PRACTICE) || IS_SET(victim->act, ACT_IS_HEALER))
			return true;

		if (!is_npc(ch))
		{
			/* no pets */
			if (IS_SET(victim->act, ACT_PET))
				return true;

			/* no charmed creatures unless owner */
			if (is_affected_by(victim, AFF_CHARM) && (area || ch != victim->master))
				return true;

			/* legal kill? -- cannot hit mob fighting non-group member */
			if (victim->fighting != nullptr && !is_same_group(ch, victim->fighting))
				return true;
		}
		else
		{
			/* area effect spells do not hit other mobs */
			if (area && !is_same_group(victim, ch->fighting))
				return true;
		}
	}
	/* killing players */
	else
	{
		if (area && is_immortal(victim) && victim->level > LEVEL_IMMORTAL)
			return true;

		/* NPC doing the killing */
		if (is_npc(ch))
		{
			/* charmed mobs and pets cannot attack players while owned */
			if (is_affected_by(ch, AFF_CHARM) && ch->master != nullptr && ch->master->fighting != victim)
				return true;

			/* safe room? */
			if (IS_SET(victim->in_room->room_flags, ROOM_SAFE))
				return true;

			/* legal kill? -- mobs only hit players grouped with opponent*/
			if (ch->fighting != nullptr && !is_same_group(ch->fighting, victim))
				return true;
		}

		/* player doing the killing */
		else
		{
			if (!is_cabal(ch))
				return true;

			if (IS_SET(victim->act, PLR_KILLER) || IS_SET(victim->act, PLR_THIEF))
				return false;

			if (!is_cabal(victim))
				return true;

			if (ch->level > victim->level + 8)
				return true;
		}
	}

	return false;
}